

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

bool comparesEqual(QRegularExpression *lhs,QRegularExpression *rhs)

{
  QRegularExpressionPrivate *pQVar1;
  QRegularExpressionPrivate *pQVar2;
  long lVar3;
  bool bVar4;
  QStringView rhs_00;
  QStringView lhs_00;
  
  pQVar1 = (rhs->d).d.ptr;
  pQVar2 = (lhs->d).d.ptr;
  if (pQVar2 == pQVar1) {
    bVar4 = true;
  }
  else {
    lVar3 = (pQVar2->pattern).d.size;
    if ((lVar3 == (pQVar1->pattern).d.size) &&
       (rhs_00.m_data = (pQVar1->pattern).d.ptr, rhs_00.m_size = lVar3,
       lhs_00.m_data = (pQVar2->pattern).d.ptr, lhs_00.m_size = lVar3,
       bVar4 = QtPrivate::equalStrings(lhs_00,rhs_00), bVar4)) {
      return (pQVar2->patternOptions).
             super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
             super_QFlagsStorage<QRegularExpression::PatternOption>.i ==
             (pQVar1->patternOptions).
             super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
             super_QFlagsStorage<QRegularExpression::PatternOption>.i;
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

constexpr P get() const noexcept { return ptr; }